

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecPtr.h
# Opt level: O1

void Vec_PtrSetEntry(Vec_Ptr_t *p,int i,void *Entry)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  long lVar4;
  int iVar5;
  
  if (i < p->nSize) goto LAB_002c696a;
  iVar1 = i + 1;
  iVar2 = p->nCap;
  iVar5 = iVar2 * 2;
  if (i < iVar5) {
    if (iVar2 < iVar5 && iVar2 <= i) {
      if (p->pArray == (void **)0x0) {
        ppvVar3 = (void **)malloc((long)iVar2 << 4);
      }
      else {
        ppvVar3 = (void **)realloc(p->pArray,(long)iVar2 << 4);
      }
      p->pArray = ppvVar3;
LAB_002c6943:
      p->nCap = iVar5;
    }
  }
  else if (iVar2 <= i) {
    if (p->pArray == (void **)0x0) {
      ppvVar3 = (void **)malloc((long)iVar1 << 3);
    }
    else {
      ppvVar3 = (void **)realloc(p->pArray,(long)iVar1 << 3);
    }
    p->pArray = ppvVar3;
    iVar5 = iVar1;
    goto LAB_002c6943;
  }
  lVar4 = (long)p->nSize;
  if (p->nSize <= i) {
    do {
      p->pArray[lVar4] = (void *)0x0;
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  p->nSize = iVar1;
LAB_002c696a:
  if ((-1 < i) && (i < p->nSize)) {
    p->pArray[(uint)i] = Entry;
    return;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
}

Assistant:

static inline void Vec_PtrSetEntry( Vec_Ptr_t * p, int i, void * Entry )
{
    Vec_PtrFillExtra( p, i + 1, NULL );
    Vec_PtrWriteEntry( p, i, Entry );
}